

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticFundamentalParameterData.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,UnderwaterAcousticFundamentalParameterData *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"Underwater Acoustic Fundamental Parameter Data:",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tAEPI:                ",0x17);
  ENUMS::GetEnumAsStringActiveEmissionParameterIndex_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui16AEPI,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tScan Pattern:        ",0x17);
  ENUMS::GetEnumAsStringScanPattern_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)this->m_ui16ScanPattern,Value_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tBeam Center Azimuth: ",0x17);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32BeamCenterAzimuth);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tAzimuthal Beamwidth: ",0x17);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32AzimuthalBeamWidth);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tBeam Center D/E:     ",0x17);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32BeamCenterDE);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tD/E Beamwidth:       ",0x17);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32DEBeamwidth);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString UnderwaterAcousticFundamentalParameterData::GetAsString() const
{
    KStringStream ss;

    ss << "Underwater Acoustic Fundamental Parameter Data:"
       << "\n\tAEPI:                " << GetEnumAsStringActiveEmissionParameterIndex( m_ui16AEPI )
       << "\n\tScan Pattern:        " << GetEnumAsStringScanPattern( m_ui16ScanPattern )
       << "\n\tBeam Center Azimuth: " << m_f32BeamCenterAzimuth
       << "\n\tAzimuthal Beamwidth: " << m_f32AzimuthalBeamWidth
       << "\n\tBeam Center D/E:     " << m_f32BeamCenterDE
       << "\n\tD/E Beamwidth:       " << m_f32DEBeamwidth
       << "\n";

    return ss.str();
}